

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

int pmain(lua_State *L)

{
  char cVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  size_t len;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  undefined8 *puVar13;
  long lVar14;
  bool bVar15;
  undefined4 local_3c;
  
  lVar3 = smain_0;
  globalL = L;
  luaJIT_version_2_1_1741897244();
  uVar8 = 1;
  uVar9 = 0;
LAB_00106866:
  pcVar6 = *(char **)(lVar3 + (long)(int)uVar8 * 8);
  if ((pcVar6 == (char *)0x0) || (*pcVar6 != '-')) goto LAB_0010691f;
  cVar1 = pcVar6[1];
  uVar12 = 2;
  switch(cVar1) {
  case 'b':
    if (uVar9 != 0) goto switchD_00106895_caseD_63;
    uVar8 = uVar8 + 1;
    uVar9 = 4;
LAB_0010691f:
    if ((int)uVar8 < 0) {
switchD_00106895_caseD_63:
      fputs("usage: ",_stderr);
      fputs(progname,_stderr);
      fputs(" [options]... [script [args]...].\nAvailable options are:\n  -e chunk  Execute string \'chunk\'.\n  -l name   Require library \'name\'.\n  -b ...    Save or list bytecode.\n  -j cmd    Perform LuaJIT control command.\n  -O[opt]   Control LuaJIT optimizations.\n  -i        Enter interactive mode after executing \'script\'.\n  -v        Show version information.\n  -E        Ignore environment variables.\n  --        Stop handling options.\n  -         Execute stdin and stop handling options.\n"
            ,_stderr);
      fflush(_stderr);
      smain_2 = 1;
      return 0;
    }
    if ((uVar9 & 0x10) != 0) {
      lua_pushboolean(L,1);
      lua_setfield(L,-10000,"LUA_NOENV");
    }
    uVar10 = 0;
    lua_gc(L,0,0);
    luaL_openlibs(L);
    local_3c = 1;
    lua_gc(L,1,-1);
    uVar12 = smain_1;
    lua_createtable(L,smain_1 - uVar8,uVar8);
    uVar11 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar11 = uVar10;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      lua_pushstring(L,*(char **)(lVar3 + uVar10 * 8));
      lua_rawseti(L,-2,(int)uVar10 - uVar8);
    }
    lua_setfield(L,-0x2712,"arg");
    if ((uVar9 & 0x10) == 0) {
      pcVar6 = getenv("LUA_INIT");
      if (pcVar6 == (char *)0x0) {
        smain_2 = 0;
      }
      else {
        if (*pcVar6 == '@') {
          smain_2 = dofile(L,pcVar6 + 1);
        }
        else {
          smain_2 = dostring(L,pcVar6,"=LUA_INIT");
        }
        if (smain_2 != 0) {
          return 0;
        }
      }
    }
    if ((uVar9 & 2) != 0) {
      print_version();
    }
    iVar5 = 1;
    do {
      if ((int)uVar8 <= iVar5) {
        smain_2 = 0;
        if ((int)uVar8 < (int)smain_1) {
          pcVar6 = *(char **)(lVar3 + (ulong)uVar8 * 8);
          if ((*pcVar6 == '-') && (pcVar6[1] == '\0')) {
            pcVar7 = *(char **)(lVar3 + -8 + (ulong)uVar8 * 8);
            if ((*pcVar7 == '-') && (pcVar7[1] == '-')) {
              if (pcVar7[2] != '\0') {
                pcVar6 = (char *)0x0;
              }
            }
            else {
              pcVar6 = (char *)0x0;
            }
          }
          iVar5 = luaL_loadfile(L,pcVar6);
          if (iVar5 == 0) {
            lua_getfield(L,-0x2712,"arg");
            iVar5 = lua_type(L,-1);
            if (iVar5 == 5) {
              uVar12 = 0;
              iVar5 = 1;
              do {
                uVar12 = uVar12 - 1;
                lua_rawgeti(L,uVar12,iVar5);
                iVar4 = lua_type(L,-1);
                iVar5 = iVar5 + 1;
              } while (iVar4 != 0);
              lua_settop(L,-2);
              lua_remove(L,uVar12);
              uVar12 = ~uVar12;
            }
            else {
              lua_settop(L,-2);
              uVar12 = 0;
            }
            iVar5 = docall(L,uVar12,0);
          }
          report(L,iVar5);
          smain_2 = iVar5;
          if (iVar5 != 0) {
            return 0;
          }
        }
        if ((uVar9 & 1) == 0) {
          if ((uVar9 & 6) != 0) {
            return 0;
          }
          if (smain_1 != uVar8) {
            return 0;
          }
          iVar5 = isatty(0);
          if (iVar5 == 0) {
            dofile(L,(char *)0x0);
            return 0;
          }
          print_version();
        }
        print_jit_status(L);
        dotty(L);
        return 0;
      }
      lVar14 = (long)iVar5;
      lVar2 = *(long *)(lVar3 + lVar14 * 8);
      if (lVar2 != 0) {
        cVar1 = *(char *)(lVar2 + 1);
        if (cVar1 == 'O') {
          lua_getfield(L,-10000,"_LOADED");
          lua_getfield(L,-1,"jit.opt");
          lua_remove(L,-2);
          lua_getfield(L,-1,"start");
          lua_remove(L,-2);
          iVar4 = runcmdopt(L,(char *)(lVar2 + 2));
        }
        else if (cVar1 == 'e') {
          if (*(char *)(lVar2 + 2) == '\0') {
            iVar5 = iVar5 + 1;
            pcVar6 = *(char **)(lVar3 + 8 + lVar14 * 8);
          }
          else {
            pcVar6 = (char *)(lVar2 + 2);
          }
          iVar4 = dostring(L,pcVar6,"=(command line)");
        }
        else if (cVar1 == 'j') {
          if (*(char *)(lVar2 + 2) == '\0') {
            iVar5 = iVar5 + 1;
            pcVar6 = *(char **)(lVar3 + 8 + lVar14 * 8);
          }
          else {
            pcVar6 = (char *)(lVar2 + 2);
          }
          pcVar7 = strchr(pcVar6,0x3d);
          if (pcVar7 == (char *)0x0) {
            len = strlen(pcVar6);
          }
          else {
            len = (long)pcVar7 - (long)pcVar6;
          }
          lua_pushlstring(L,pcVar6,len);
          lua_getfield(L,-10000,"_LOADED");
          lua_getfield(L,-1,"jit");
          lua_remove(L,-2);
          lua_pushvalue(L,-2);
          lua_gettable(L,-2);
          iVar4 = lua_type(L,-1);
          if (iVar4 == 6) {
            lua_remove(L,-2);
          }
          else {
            lua_settop(L,-3);
            iVar4 = loadjitmodule(L);
            if (iVar4 != 0) {
              smain_2 = 1;
              return 0;
            }
          }
          lua_remove(L,-2);
          pcVar6 = pcVar7 + 1;
          if (pcVar7 == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          iVar4 = runcmdopt(L,pcVar6);
        }
        else {
          if (cVar1 != 'l') {
            if (cVar1 == 'b') {
              lua_pushlstring(L,"bcsave",6);
              iVar5 = loadjitmodule(L);
              if (iVar5 == 0) {
                lVar2 = *(long *)(lVar3 + lVar14 * 8);
                bVar15 = *(char *)(lVar2 + 2) != '\0';
                if (bVar15) {
                  *(undefined1 *)(lVar2 + 1) = 0x2d;
                  lua_pushstring(L,(char *)(*(long *)(lVar3 + lVar14 * 8) + 1));
                }
                uVar8 = (uint)bVar15;
                puVar13 = (undefined8 *)(lVar3 + lVar14 * 8);
                while( true ) {
                  puVar13 = puVar13 + 1;
                  if ((char *)*puVar13 == (char *)0x0) break;
                  lua_pushstring(L,(char *)*puVar13);
                  uVar8 = uVar8 + 1;
                }
                iVar5 = lua_pcall(L,uVar8,0,0);
                report(L,iVar5);
                local_3c = 0xffffffff;
              }
              smain_2 = local_3c;
              return 0;
            }
            goto LAB_00106c81;
          }
          if (*(char *)(lVar2 + 2) == '\0') {
            iVar5 = iVar5 + 1;
            pcVar6 = *(char **)(lVar3 + 8 + lVar14 * 8);
          }
          else {
            pcVar6 = (char *)(lVar2 + 2);
          }
          lua_getfield(L,-0x2712,"require");
          lua_pushstring(L,pcVar6);
          iVar4 = docall(L,1,1);
          report(L,iVar4);
        }
        if (iVar4 != 0) {
          smain_2 = 1;
          return 0;
        }
      }
LAB_00106c81:
      iVar5 = iVar5 + 1;
    } while( true );
  case 'c':
  case 'd':
  case 'f':
  case 'g':
  case 'h':
  case 'k':
    goto switchD_00106895_caseD_63;
  case 'e':
    uVar9 = uVar9 | 4;
  case 'j':
  case 'l':
    uVar9 = uVar9 | 8;
    if (pcVar6[2] == '\0') {
      if (*(long *)(lVar3 + 8 + (long)(int)uVar8 * 8) == 0) goto switchD_00106895_caseD_63;
      uVar8 = uVar8 + 1;
    }
    break;
  case 'i':
    if (pcVar6[2] != '\0') goto switchD_00106895_caseD_63;
    uVar9 = uVar9 | 1;
LAB_001068e9:
    uVar9 = uVar9 | uVar12;
    break;
  default:
    if (cVar1 == 'E') {
      uVar12 = 0x10;
      goto LAB_001068e9;
    }
    if (cVar1 != 'O') {
      if (cVar1 == 'v') {
        if (pcVar6[2] == '\0') goto LAB_001068e9;
        goto switchD_00106895_caseD_63;
      }
      if (cVar1 != '\0') {
        if ((cVar1 != '-') || (pcVar6[2] != '\0')) goto switchD_00106895_caseD_63;
        uVar8 = uVar8 + 1;
      }
      goto LAB_0010691f;
    }
  }
  uVar8 = uVar8 + 1;
  goto LAB_00106866;
}

Assistant:

static int pmain(lua_State *L)
{
  struct Smain *s = &smain;
  char **argv = s->argv;
  int argn;
  int flags = 0;
  globalL = L;
  LUAJIT_VERSION_SYM();  /* Linker-enforced version check. */

  argn = collectargs(argv, &flags);
  if (argn < 0) {  /* Invalid args? */
    print_usage();
    s->status = 1;
    return 0;
  }

  if ((flags & FLAGS_NOENV)) {
    lua_pushboolean(L, 1);
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }

  /* Stop collector during library initialization. */
  lua_gc(L, LUA_GCSTOP, 0);
  luaL_openlibs(L);
  lua_gc(L, LUA_GCRESTART, -1);

  createargtable(L, argv, s->argc, argn);

  if (!(flags & FLAGS_NOENV)) {
    s->status = handle_luainit(L);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_VERSION)) print_version();

  s->status = runargs(L, argv, argn);
  if (s->status != LUA_OK) return 0;

  if (s->argc > argn) {
    s->status = handle_script(L, argv + argn);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_INTERACTIVE)) {
    print_jit_status(L);
    dotty(L);
  } else if (s->argc == argn && !(flags & (FLAGS_EXEC|FLAGS_VERSION))) {
    if (lua_stdin_is_tty()) {
      print_version();
      print_jit_status(L);
      dotty(L);
    } else {
      dofile(L, NULL);  /* Executes stdin as a file. */
    }
  }
  return 0;
}